

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::APISpecificData::Start(APISpecificData *this)

{
  snd_pcm_t **ppsVar1;
  uint uVar2;
  uint uVar3;
  snd_pcm_t *psVar4;
  snd_pcm_hw_params_t *psVar5;
  snd_pcm_uframes_t sVar6;
  int iVar7;
  long lVar8;
  size_t __n;
  uchar *puVar9;
  ulong uVar10;
  char *__s;
  uint uVar11;
  YSRESULT YVar12;
  undefined8 uStack_40;
  snd_pcm_hw_params_t asStack_38 [8];
  undefined4 local_30;
  undefined1 local_2c [4];
  uint request;
  int dir;
  
  ppsVar1 = &this->handle;
  YVar12 = YSERR;
  uStack_40 = 0x113045;
  iVar7 = snd_pcm_open(ppsVar1,"default",0,1);
  if (iVar7 < 0) {
    uStack_40 = 0x1131ea;
    puts("Cannot open PCM device.");
    *ppsVar1 = (snd_pcm_t *)0x0;
    YVar12 = YSERR;
  }
  else {
    uStack_40 = 0x113052;
    lVar8 = snd_pcm_hw_params_sizeof();
    lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
    this->hwParam = asStack_38 + lVar8;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11306c;
    __n = snd_pcm_hw_params_sizeof();
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113079;
    memset(asStack_38 + lVar8,0,__n);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113086;
    snd_pcm_hw_params_any(psVar4,psVar5);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113098;
    snd_pcm_hw_params_set_access(psVar4,psVar5,3);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1130aa;
    snd_pcm_hw_params_set_format(psVar4,psVar5,2);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1130bc;
    snd_pcm_hw_params_set_channels(psVar4,psVar5,1);
    local_30 = 8000;
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1130d7;
    snd_pcm_hw_params_set_rate_near(psVar4,psVar5,&local_30,local_2c);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1130e4;
    iVar7 = snd_pcm_hw_params(psVar4,psVar5);
    if (iVar7 < 0) {
      __s = "Cannot set hardward parameters.";
    }
    else {
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1130f9;
      snd_pcm_hw_params_get_channels(psVar5,&this->nChannel);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11310d;
      snd_pcm_hw_params_get_rate(psVar5,&this->rate,local_2c);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11311d;
      snd_pcm_hw_params_get_period_size(psVar5,&this->nPeriod,local_2c);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11312a;
      snd_pcm_hw_params_get_buffer_size(psVar5,&this->bufSize);
      uVar11 = this->nChannel;
      uVar2 = this->rate;
      sVar6 = this->nPeriod;
      uVar3 = this->bufSize;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113148;
      printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",(ulong)uVar11,(ulong)uVar2,
             (ulong)(uint)sVar6,(ulong)uVar3);
      uVar11 = (int)this->nPeriod * 4;
      this->bufSizeInNStep = uVar11;
      uVar11 = uVar11 * this->bytePerTimeStep;
      this->bufSizeInByte = uVar11;
      puVar9 = this->writeBuf;
      if (puVar9 != (uchar *)0x0) {
        *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11316b;
        operator_delete__(puVar9);
        uVar11 = this->bufSizeInByte;
      }
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113177;
      puVar9 = (uchar *)operator_new__((ulong)uVar11);
      this->writeBuf = puVar9;
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          this->writeBuf[uVar10] = '\0';
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->bufSizeInByte);
      }
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x11319e;
      snd_pcm_prepare(psVar4);
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1131ab;
      iVar7 = snd_pcm_wait(psVar4,1000);
      if (iVar7 == 0) {
        *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1131bb;
        puts("snd_pcm_wait timed out.");
        *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1131c7;
        puts("There may be no sound.");
      }
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x1131cf;
      snd_pcm_start(psVar4);
      YVar12 = YSOK;
      __s = "YsSoundPlayer started.";
    }
    *(undefined8 *)(asStack_38 + lVar8 + -8) = 0x113202;
    puts(__s);
  }
  return YVar12;
}

Assistant:

YSRESULT YsSoundPlayer::APISpecificData::Start(void)
{
	int res=snd_pcm_open(&handle,"default",SND_PCM_STREAM_PLAYBACK,SND_PCM_NONBLOCK);
	if(0>res)
	{
		printf("Cannot open PCM device.\n");
		handle=nullptr;
		return YSERR;
	}

	snd_pcm_hw_params_alloca(&hwParam);
	snd_pcm_hw_params_any(handle,hwParam);
	snd_pcm_hw_params_set_access(handle,hwParam,SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(handle,hwParam,SND_PCM_FORMAT_S16_LE);
	snd_pcm_hw_params_set_channels(handle,hwParam,1);

	unsigned int request=8000;//22050;
	int dir;  // What's dir?
	snd_pcm_hw_params_set_rate_near(handle,hwParam,&request,&dir);

	if(0>snd_pcm_hw_params(handle,hwParam))
	{
		printf("Cannot set hardward parameters.\n");
		return YSERR;
	}

	snd_pcm_hw_params_get_channels(hwParam,&nChannel);
	snd_pcm_hw_params_get_rate(hwParam,&rate,&dir);
	snd_pcm_hw_params_get_period_size(hwParam,&nPeriod,&dir);
	snd_pcm_hw_params_get_buffer_size(hwParam,(snd_pcm_uframes_t *)&bufSize);
	printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",
		   nChannel,rate,(int)nPeriod,(int)bufSize);

	bufSizeInNStep=nPeriod*4;
	bufSizeInByte=bufSizeInNStep*bytePerTimeStep;
	if(nullptr!=writeBuf)
	{
		delete [] writeBuf;
	}
	writeBuf=new unsigned char [bufSizeInByte];
	for(int i=0; i<bufSizeInByte; ++i)
	{
		writeBuf[i]=0;
	}

	// snd_pcm_sw_params_alloca(&swParam);
	// snd_async_add_pcm_handler(&asyncHandler,handle,KeepPlayingCallBack,this);


	snd_pcm_prepare(handle);
	if(0==snd_pcm_wait(handle,1000))
	{
		printf("snd_pcm_wait timed out.\n");
		printf("There may be no sound.\n");
	}
	snd_pcm_start(handle);

	printf("YsSoundPlayer started.\n");

	return YSOK;
}